

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O2

int poly_mulmod(uint64_t *p1,uint64_t *p2,size_t n,uint64_t q,uint64_t *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong *puVar7;
  size_t sVar8;
  size_t j;
  size_t sVar9;
  uint64_t *local_50;
  
  memset(result,0,n * 8);
  puVar3 = result + -n;
  local_50 = result;
  for (sVar8 = 0; sVar8 != n; sVar8 = sVar8 + 1) {
    puVar7 = puVar3;
    for (sVar9 = 0; n != sVar9; sVar9 = sVar9 + 1) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = p2[sVar9];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = p1[sVar8];
      lVar4 = __umodti3(SUB168(auVar1 * auVar2,0),SUB168(auVar1 * auVar2,8),q,0);
      if (sVar9 + sVar8 < n) {
        uVar5 = lVar4 + local_50[sVar9];
        puVar6 = result + sVar9 + sVar8;
      }
      else {
        uVar5 = (q - lVar4) + *puVar7;
        puVar6 = puVar7;
      }
      *puVar6 = uVar5 % q;
      puVar7 = puVar7 + 1;
    }
    puVar3 = puVar3 + 1;
    local_50 = local_50 + 1;
  }
  return 0;
}

Assistant:

int poly_mulmod(uint64_t p1[], uint64_t p2[], size_t n, uint64_t q, uint64_t result[]) {

    memset(result, 0, n*sizeof(uint64_t));

    // p1 * p2 mod (x^n + 1)
    // the fact is exploited that x^n = -1   mod (x^n + 1)
    for(size_t i = 0; i < n; i++) {
        for(size_t j = 0; j < n; j++) {
            uint64_t tmp = mulmod(p1[i], p2[j], q);
            if(i+j < n) {
                result[i+j] = (result[i+j] + tmp) % q;
            } else {
                result[i+j-n] = (result[i+j-n] + q - tmp) %q;
            }
        }
    }

    return 0;

}